

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::
HashIndex<kj::HashMap<kj::Array<unsigned_char>,capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Callbacks>
::
find<kj::HashMap<kj::Array<unsigned_char>,capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Entry,kj::Array<unsigned_char>&>
          (HashIndex<kj::HashMap<kj::Array<unsigned_char>,capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Callbacks>
           *this,ArrayPtr<kj::HashMap<kj::Array<unsigned_char>,_capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Entry>
                 table,Array<unsigned_char> *params)

{
  int iVar1;
  Disposer *pDVar2;
  bool bVar3;
  uint uVar4;
  Vat *pVVar5;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar6;
  Entry *pEVar7;
  Array<unsigned_char> *in_R8;
  uint uVar8;
  ulong uVar9;
  Maybe<unsigned_long> MVar10;
  
  pEVar7 = table.ptr;
  aVar6.value = table.size_;
  if ((pEVar7->value).ptr != (Vat *)0x0) {
    uVar4 = hashCode<kj::Array<unsigned_char>&>(in_R8);
    pVVar5 = (pEVar7->value).ptr;
    uVar8 = (int)pVVar5 - 1U & uVar4;
    aVar6 = extraout_RDX;
    while( true ) {
      uVar9 = (ulong)uVar8;
      pDVar2 = (pEVar7->value).disposer;
      iVar1 = *(int *)((long)&pDVar2[uVar9]._vptr_Disposer + 4);
      if (iVar1 == 0) break;
      if ((iVar1 != 1) && (*(uint *)&pDVar2[uVar9]._vptr_Disposer == uVar4)) {
        bVar3 = Array<unsigned_char>::operator==
                          ((Array<unsigned_char> *)((ulong)(iVar1 - 2) * 0x38 + table.size_),in_R8);
        aVar6 = extraout_RDX_00;
        if (bVar3) {
          iVar1 = *(int *)((long)&pDVar2[uVar9]._vptr_Disposer + 4);
          *this = (HashIndex<kj::HashMap<kj::Array<unsigned_char>,capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Callbacks>
                   )0x1;
          *(ulong *)(this + 8) = (ulong)(iVar1 - 2);
          goto LAB_002d1af8;
        }
        pVVar5 = (pEVar7->value).ptr;
      }
      uVar8 = (uint)(Vat *)(uVar9 + 1);
      if ((Vat *)(uVar9 + 1) == pVVar5) {
        uVar8 = 0;
      }
    }
  }
  *this = (HashIndex<kj::HashMap<kj::Array<unsigned_char>,capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Callbacks>
           )0x0;
LAB_002d1af8:
  MVar10.ptr.field_1.value = aVar6.value;
  MVar10.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar10.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return kj::none;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return kj::none;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }